

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.cpp
# Opt level: O2

void __thiscall Move::Move(Move *this,Position *initialPosition,NurseSolution *movedNurse)

{
  allocator local_31;
  string local_30;
  
  Position::Position(&this->initialPosition,initialPosition);
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  Position::Position(&this->lastPosition,-1,(ShiftType *)0x0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  this->movedNurse = movedNurse;
  this->tradedNurse = (NurseSolution *)0x0;
  return;
}

Assistant:

Move::Move(Position initialPosition, NurseSolution* movedNurse) : initialPosition(initialPosition), movedNurse(movedNurse){}